

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

int nni_sock_getopt(nni_sock *s,char *name,void *val,size_t *szp,nni_type t)

{
  int rv;
  nni_type t_local;
  size_t *szp_local;
  void *val_local;
  char *name_local;
  nni_sock *s_local;
  
  nni_mtx_lock(&s->s_mx);
  if ((s->s_closing & 1U) == 0) {
    s_local._4_4_ = nni_getopt((s->s_sock_ops).sock_options,name,s->s_data,val,szp,t);
    if (s_local._4_4_ == 9) {
      s_local._4_4_ = nni_getopt(sock_options,name,s,val,szp,t);
      if (s_local._4_4_ == 9) {
        nni_mtx_unlock(&s->s_mx);
      }
      else {
        nni_mtx_unlock(&s->s_mx);
      }
    }
    else {
      nni_mtx_unlock(&s->s_mx);
    }
  }
  else {
    nni_mtx_unlock(&s->s_mx);
    s_local._4_4_ = 7;
  }
  return s_local._4_4_;
}

Assistant:

int
nni_sock_getopt(
    nni_sock *s, const char *name, void *val, size_t *szp, nni_type t)
{
	int rv;

	nni_mtx_lock(&s->s_mx);
	if (s->s_closing) {
		nni_mtx_unlock(&s->s_mx);
		return (NNG_ECLOSED);
	}

	// Protocol specific options.  The protocol can override
	// options like the send buffer or notification descriptors
	// this way.
	rv = nni_getopt(
	    s->s_sock_ops.sock_options, name, s->s_data, val, szp, t);
	if (rv != NNG_ENOTSUP) {
		nni_mtx_unlock(&s->s_mx);
		return (rv);
	}

	// Socket generic options.
	rv = nni_getopt(sock_options, name, s, val, szp, t);
	if (rv != NNG_ENOTSUP) {
		nni_mtx_unlock(&s->s_mx);
		return (rv);
	}

	nni_mtx_unlock(&s->s_mx);
	return (rv);
}